

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deUniquePtr.hpp
# Opt level: O2

void __thiscall
de::details::
UniqueBase<vkt::memory::(anonymous_namespace)::Memory,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Memory>_>
::reset(UniqueBase<vkt::memory::(anonymous_namespace)::Memory,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::Memory>_>
        *this)

{
  Memory *pMVar1;
  
  pMVar1 = (this->m_data).ptr;
  if (pMVar1 != (Memory *)0x0) {
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase
              (&(pMVar1->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>);
    operator_delete(pMVar1,0x48);
    (this->m_data).ptr = (Memory *)0x0;
  }
  return;
}

Assistant:

void UniqueBase<T, D>::reset (void)
{
	if (m_data.ptr != DE_NULL)
	{
		m_data.deleter(m_data.ptr);
		m_data.ptr = DE_NULL;
	}
}